

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::TestCaseFilters::~TestCaseFilters(TestCaseFilters *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->m_name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_name).field_2) {
    operator_delete(pcVar1);
  }
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector
            (&this->m_exclusionFilters);
  std::vector<Catch::TestCaseFilter,_std::allocator<Catch::TestCaseFilter>_>::~vector
            (&this->m_inclusionFilters);
  std::vector<Catch::TagExpression,_std::allocator<Catch::TagExpression>_>::~vector
            (&this->m_tagExpressions);
  return;
}

Assistant:

TestCaseFilters( std::string const& name ) : m_name( name ) {}